

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O3

void __thiscall
asio::detail::scoped_ptr<asio::io_context::work>::reset
          (scoped_ptr<asio::io_context::work> *this,work *p)

{
  work *pwVar1;
  
  pwVar1 = this->p_;
  if (pwVar1 != (work *)0x0) {
    scheduler::work_finished(pwVar1->io_context_impl_);
  }
  operator_delete(pwVar1);
  this->p_ = p;
  return;
}

Assistant:

void reset(T* p = 0)
  {
    delete p_;
    p_ = p;
  }